

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTableIterator::MemTableIterator(MemTableIterator *this,Table *table)

{
  Table *table_local;
  MemTableIterator *this_local;
  
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__MemTableIterator_001e54d0;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Iterator(&this->iter_,table);
  std::__cxx11::string::string((string *)&this->tmp_);
  return;
}

Assistant:

explicit MemTableIterator(MemTable::Table* table) : iter_(table) {}